

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

bool __thiscall FMultiBlockLinesIterator::Next(FMultiBlockLinesIterator *this,CheckResult *item)

{
  uint uVar1;
  undefined2 uVar2;
  FPortalGroupArray *pFVar3;
  bool bVar4;
  ushort uVar5;
  short sVar6;
  line_t_conflict *plVar7;
  WORD *pWVar8;
  uint uVar9;
  ushort uVar10;
  double x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double x_00;
  double x_01;
  double in_XMM1_Qa;
  
LAB_0041a691:
  plVar7 = FBlockLinesIterator::Next(&this->blockIterator);
  if (plVar7 != (line_t_conflict *)0x0) {
    item->line = (line_t *)plVar7;
    (item->Position).X = (this->offset).X;
    (item->Position).Y = (this->offset).Y;
    item->portalflags = (int)this->portalflags;
    return true;
  }
  uVar1 = (int)this->index + 1;
  pFVar3 = this->checklist;
  uVar9 = (uint)pFVar3->varused + (pFVar3->data).Count;
  uVar10 = 0;
  if (uVar1 < uVar9) {
    pWVar8 = pFVar3->entry + uVar1;
    if (3 < uVar1) {
      pWVar8 = (pFVar3->data).Array + ((int)this->index - 3);
    }
    uVar10 = *pWVar8 & 0xc000;
  }
  if (uVar10 == 0x8000 || this->portalflags != 0x20) {
    x_00 = x;
    if (uVar10 != 0x4000 && this->portalflags == 0x40) {
      bVar4 = GoDown(this,x,in_XMM1_Qa);
      x_00 = extraout_XMM0_Qa_00;
      goto LAB_0041a723;
    }
  }
  else {
    bVar4 = GoUp(this,x,in_XMM1_Qa);
    x_00 = extraout_XMM0_Qa;
LAB_0041a723:
    if (bVar4 != false) goto LAB_0041a691;
  }
  if (uVar1 < uVar9) {
    uVar2 = this->index;
    uVar5 = uVar2 + 1;
    this->index = uVar5;
    pWVar8 = this->checklist->entry + (uint)(int)(short)uVar5;
    if (3 < uVar5) {
      pWVar8 = (this->checklist->data).Array + ((int)(short)uVar5 - 4);
    }
    startIteratorForGroup(this,*pWVar8 & 0x3fff);
    sVar6 = (ushort)(uVar10 == 0x4000) << 6;
    if (uVar10 == 0x8000) {
      sVar6 = 0x20;
    }
    this->portalflags = sVar6;
  }
  else {
    this->cursector = this->startsector;
    bVar4 = GoUp(this,x_00,in_XMM1_Qa);
    if ((!bVar4) && (bVar4 = GoDown(this,x_01,in_XMM1_Qa), !bVar4)) {
      return false;
    }
  }
  goto LAB_0041a691;
}

Assistant:

bool FMultiBlockLinesIterator::Next(FMultiBlockLinesIterator::CheckResult *item)
{
	line_t *line = blockIterator.Next();
	if (line != NULL)
	{
		item->line = line;
		item->Position.X = offset.X;
		item->Position.Y = offset.Y;
		item->portalflags = portalflags;
		return true;
	}
	bool onlast = unsigned(index + 1) >= checklist.Size();
	int nextflags = onlast ? 0 : checklist[index + 1] & FPortalGroupArray::FLAT;

	if (portalflags == FFCF_NOFLOOR && nextflags != FPortalGroupArray::UPPER)
	{
		// if this is the last upper portal in the list, check if we need to go further up to find the real ceiling.
		if (GoUp(offset.X, offset.Y)) return Next(item);
	}
	else if (portalflags == FFCF_NOCEILING && nextflags != FPortalGroupArray::LOWER)
	{
		// if this is the last lower portal in the list, check if we need to go further down to find the real floor.
		if (GoDown(offset.X, offset.Y)) return Next(item);
	}
	if (onlast)
	{
		cursector = startsector;
		// We reached the end of the list. Check if we still need to check up- and downwards.
		if (GoUp(checkpoint.X, checkpoint.Y) ||
			GoDown(checkpoint.X, checkpoint.Y))
		{
			return Next(item);
		}
		return false;
	}

	index++;
	startIteratorForGroup(checklist[index] & ~FPortalGroupArray::FLAT);
	switch (nextflags)
	{
	case FPortalGroupArray::UPPER:
		portalflags = FFCF_NOFLOOR;
		break;

	case FPortalGroupArray::LOWER:
		portalflags = FFCF_NOCEILING;
		break;

	default:
		portalflags = 0;
	}

	return Next(item);
}